

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

typed_address<pstore::trailer> __thiscall
pstore::database::older_revision_footer_pos(database *this,uint revision)

{
  uint uVar1;
  typed_address<pstore::trailer> pos;
  shared_ptr<const_pstore::trailer> tail;
  _func_int **local_38;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_30;
  
  if (revision != 0xffffffff) {
    uVar1 = get_current_revision(this);
    if (revision <= uVar1) {
      pos.a_.a_ = (address)(this->size_).footer_pos_.a_.a_;
      do {
        getro<pstore::trailer,void>
                  ((database *)&stack0xffffffffffffffc8,(typed_address<pstore::trailer>)this,
                   (size_t)pos.a_.a_);
        uVar1 = *(uint *)(local_38 + 1);
        if (uVar1 < revision) {
          raise<pstore::error_code>(unknown_revision);
        }
        if (uVar1 != revision) {
          pos.a_.a_ = (address)((address *)(local_38 + 4))->a_;
          trailer::validate(this,pos);
        }
        if (local_30._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_head_impl);
        }
      } while (uVar1 != revision);
      return (address)pos.a_.a_;
    }
  }
  raise<pstore::error_code>(unknown_revision);
}

Assistant:

typed_address<trailer> database::older_revision_footer_pos (unsigned const revision) const {
        if (revision == pstore::head_revision || revision > this->get_current_revision ()) {
            raise (pstore::error_code::unknown_revision);
        }

        // Walk backwards down the linked list of revisions to find it.
        typed_address<trailer> footer_pos = size_.footer_pos ();
        for (;;) {
            auto const tail = this->getro (footer_pos);
            unsigned int const tail_revision = tail->a.generation;
            if (revision > tail_revision) {
                raise (pstore::error_code::unknown_revision);
            }
            if (tail_revision == revision) {
                break;
            }

            // TODO: check that footer_pos and generation number are getting smaller; time must
            // not be getting larger.
            footer_pos = tail->a.prev_generation;
            trailer::validate (*this, footer_pos);
        }

        return footer_pos;
    }